

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphElements.cpp
# Opt level: O0

int __thiscall
dg::vr::VRLocation::connect(VRLocation *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int extraout_EAX;
  VRLocation *t;
  socklen_t __len_00;
  sockaddr *__addr_00;
  pointer in_stack_ffffffffffffffc8;
  VREdge *in_stack_ffffffffffffffe0;
  
  t = (VRLocation *)operator_new(0x20);
  __len_00 = (socklen_t)__addr;
  VREdge::VREdge(in_stack_ffffffffffffffe0,this,t,(VROp *)in_stack_ffffffffffffffc8);
  std::unique_ptr<dg::vr::VREdge,std::default_delete<dg::vr::VREdge>>::
  unique_ptr<std::default_delete<dg::vr::VREdge>,void>
            ((unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_> *)t,
             in_stack_ffffffffffffffc8);
  connect(this,(int)&stack0xffffffffffffffe0,__addr_00,__len_00);
  std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>::~unique_ptr
            ((unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_> *)t);
  return extraout_EAX;
}

Assistant:

void VRLocation::connect(VRLocation *target, VROp *op) {
    connect(std::unique_ptr<VREdge>(new VREdge(this, target, op)));
}